

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree * kvtree_getf(kvtree *hash,char *format,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  kvtree_elem *pkVar5;
  void **ppvVar6;
  undefined8 in_RCX;
  ulong uVar7;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar8;
  uint uVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char *rest;
  char *format_copy;
  char key [1024];
  undefined8 local_518;
  void **local_510;
  char *local_4f8;
  char *local_4f0;
  void *local_4e8 [4];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438 [1032];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (hash == (kvtree *)0x0) {
    hash = (kvtree_struct *)0x0;
  }
  else {
    local_4f8 = (char *)0x0;
    local_4e8[2] = (void *)in_RDX;
    local_4e8[3] = (void *)in_RCX;
    local_4c8 = in_R8;
    local_4c0 = in_R9;
    pcVar4 = strdup(format);
    local_4f0 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1ac);
    }
    pcVar4 = strtok_r(pcVar4," ",&local_4f8);
    uVar8 = 0;
    if (pcVar4 != (char *)0x0) {
      do {
        pcVar4 = strtok_r((char *)0x0," ",&local_4f8);
        uVar8 = uVar8 + 1;
      } while (pcVar4 != (char *)0x0);
    }
    kvtree_free(&local_4f0);
    local_4f0 = strdup(format);
    if (local_4f0 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1c3);
    }
    local_510 = &args[0].overflow_arg_area;
    local_518 = 0x3000000010;
    pcVar4 = strtok_r(local_4f0," ",&local_4f8);
    if (pcVar4 != (char *)0x0 && uVar8 != 0) {
      uVar9 = 1;
      do {
        cVar1 = *pcVar4;
        if (cVar1 == '%') {
          if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) goto LAB_00104330;
          if ((pcVar4[1] != 'd') || (pcVar4[2] != '\0')) goto LAB_00104273;
LAB_0010436e:
          uVar7 = local_518 & 0xffffffff;
          if (uVar7 < 0x29) {
            local_518 = CONCAT44(local_518._4_4_,(int)local_518 + 8);
            ppvVar6 = (void **)((long)local_4e8 + uVar7);
          }
          else {
            ppvVar6 = local_510;
            local_510 = local_510 + 1;
          }
          uVar3 = snprintf(local_438,0x400,pcVar4,(ulong)*(uint *)ppvVar6);
LAB_001043a9:
          if (0x3ff < uVar3) {
            kvtree_abort(-1,"Key buffer too small, have %lu need %d bytes @ %s:%d",0x400,
                         (ulong)uVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x1ed);
          }
        }
        else {
LAB_00104273:
          iVar2 = strcmp(pcVar4,"%lld");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"%lu"), iVar2 == 0)) {
LAB_00104330:
            uVar7 = local_518 & 0xffffffff;
            if (uVar7 < 0x29) {
              local_518 = CONCAT44(local_518._4_4_,(int)local_518 + 8);
              ppvVar6 = (void **)((long)local_4e8 + uVar7);
            }
            else {
              ppvVar6 = local_510;
              local_510 = local_510 + 1;
            }
            uVar3 = snprintf(local_438,0x400,pcVar4,*ppvVar6);
            goto LAB_001043a9;
          }
          iVar2 = strcmp(pcVar4,"%#x");
          if (iVar2 == 0) goto LAB_0010436e;
          iVar2 = strcmp(pcVar4,"%#lx");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"%llu"), iVar2 == 0)) goto LAB_00104330;
          if (cVar1 == '%') {
            if ((pcVar4[1] == 'f') && (pcVar4[2] == '\0')) {
              uVar7 = (ulong)local_518._4_4_;
              if (uVar7 < 0xa1) {
                local_518 = CONCAT44(local_518._4_4_ + 0x10,(int)local_518);
                ppvVar6 = (void **)((long)local_4e8 + uVar7);
              }
              else {
                ppvVar6 = local_510;
                local_510 = local_510 + 1;
              }
              uVar3 = snprintf(local_438,0x400,pcVar4,*ppvVar6);
              goto LAB_001043a9;
            }
            if ((pcVar4[1] == 'p') && (pcVar4[2] == '\0')) goto LAB_00104330;
          }
          kvtree_abort(-1,"Unsupported hash key format \'%s\' @ %s:%d",pcVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x1e6);
        }
        pkVar5 = kvtree_elem_get(hash,local_438);
        if (pkVar5 == (kvtree_elem *)0x0) {
          hash = (kvtree_struct *)0x0;
        }
        else {
          hash = pkVar5->hash;
        }
        pcVar4 = strtok_r((char *)0x0," ",&local_4f8);
      } while (((uVar9 < uVar8) && (pcVar4 != (char *)0x0)) &&
              (uVar9 = uVar9 + 1, hash != (kvtree_struct *)0x0));
    }
    kvtree_free(&local_4f0);
  }
  return hash;
}

Assistant:

kvtree* kvtree_getf(const kvtree* hash, const char* format, ...)
{
  /* check that we have a hash */
  if (hash == NULL) {
    return NULL;
  }

  const kvtree* h = hash;
  char* rest = NULL;

  /* make a copy of the format specifier, since strtok clobbers it */
  char* format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* we break up tokens by spaces */
  char* search = " ";
  char* token = NULL;

  /* count how many keys we have */
  token = strtok_r(format_copy, search, &rest);
  int count = 0;
  while (token != NULL) {
    token = strtok_r(NULL, search, &rest);
    count++;
  }

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* make a copy of the format specifier, since strtok clobbers it */
  format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* for each format specifier, convert the next key argument to a
   * string and look up the hash for that key */
  va_list args;
  va_start(args, format);
  token = strtok_r(format_copy, search, &rest);
  int i = 0;
  while (i < count && token != NULL && h != NULL) {
    /* interpret the format and convert the current key argument to
     * a string */
    char key[KVTREE_MAX_LINE];
    int size = 0;
    if (strcmp(token, "%s") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, char*));
    } else if (strcmp(token, "%d")  == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, int));
    } else if (strcmp(token, "%lld") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, long long));
    } else if (strcmp(token, "%lu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%#x") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned int));
    } else if (strcmp(token, "%#lx") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%llu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long long));
    } else if (strcmp(token, "%f") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, double));
    } else if (strcmp(token, "%p") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, void*));
    } else {
      kvtree_abort(-1, "Unsupported hash key format '%s' @ %s:%d",
        token, __FILE__, __LINE__
      );
    }

    /* check that we were able to fit the string into our buffer */
    if (size >= sizeof(key)) {
      kvtree_abort(-1, "Key buffer too small, have %lu need %d bytes @ %s:%d",
        sizeof(key), size, __FILE__, __LINE__
      );
    }

    /* get hash for this key */
    h = kvtree_get(h, key);

    /* get the next format string */
    token = strtok_r(NULL, search, &rest);
    i++;
  }
  va_end(args);

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* return the hash we found */
  return (kvtree*) h;
}